

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwriter.h
# Opt level: O2

void aom_write_symbol(aom_writer *w,int symb,aom_cdf_prob *cdf,int nsymbs)

{
  od_ec_encode_cdf_q15(&w->ec,symb,cdf,nsymbs);
  if (w->allow_update_cdf != '\0') {
    update_cdf(cdf,(int8_t)symb,nsymbs);
    return;
  }
  return;
}

Assistant:

static inline void aom_write_symbol(aom_writer *w, int symb, aom_cdf_prob *cdf,
                                    int nsymbs) {
  aom_write_cdf(w, symb, cdf, nsymbs);
  if (w->allow_update_cdf) update_cdf(cdf, symb, nsymbs);
}